

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O1

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>::
ansicolor_sink(ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this
              )

{
  unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FILE *__stream;
  undefined1 uVar2;
  int iVar3;
  mapped_type *pmVar4;
  char **ppcVar5;
  key_type local_1c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  string *local_d8;
  string *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  string *local_b8;
  string *local_b0;
  string *local_a8;
  string *local_a0;
  string *local_98;
  string *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  sink::sink(&this->super_sink);
  (this->super_sink)._vptr_sink = (_func_int **)&PTR__ansicolor_sink_001e7ce0;
  local_b0 = &this->reset;
  local_e0 = &(this->reset).field_2;
  (this->reset)._M_dataplus._M_p = (pointer)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"\x1b[m","");
  local_1a0 = &this->bold;
  local_e8 = &(this->bold).field_2;
  (this->bold)._M_dataplus._M_p = (pointer)local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"\x1b[1m","");
  local_f0 = &(this->dark).field_2;
  (this->dark)._M_dataplus._M_p = (pointer)local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->dark,"\x1b[2m","");
  local_f8 = &(this->underline).field_2;
  (this->underline)._M_dataplus._M_p = (pointer)local_f8;
  local_38 = &this->dark;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->underline,"\x1b[4m","");
  local_100 = &(this->blink).field_2;
  (this->blink)._M_dataplus._M_p = (pointer)local_100;
  local_40 = &this->underline;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->blink,"\x1b[5m","");
  local_108 = &(this->reverse).field_2;
  (this->reverse)._M_dataplus._M_p = (pointer)local_108;
  local_48 = &this->blink;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->reverse,"\x1b[7m","");
  local_110 = &(this->concealed).field_2;
  (this->concealed)._M_dataplus._M_p = (pointer)local_110;
  local_50 = &this->reverse;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->concealed,"\x1b[8m","");
  local_60 = &this->clear_line;
  local_118 = &(this->clear_line).field_2;
  (this->clear_line)._M_dataplus._M_p = (pointer)local_118;
  local_58 = &this->concealed;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"\x1b[K","");
  local_68 = &this->black;
  local_120 = &(this->black).field_2;
  (this->black)._M_dataplus._M_p = (pointer)local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"\x1b[30m","");
  local_c0 = &this->red;
  local_128 = &(this->red).field_2;
  (this->red)._M_dataplus._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"\x1b[31m","");
  local_b8 = &this->green;
  local_130 = &(this->green).field_2;
  (this->green)._M_dataplus._M_p = (pointer)local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"\x1b[32m","");
  local_c8 = &this->yellow;
  local_138 = &(this->yellow).field_2;
  (this->yellow)._M_dataplus._M_p = (pointer)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"\x1b[33m","");
  local_70 = &this->blue;
  local_140 = &(this->blue).field_2;
  (this->blue)._M_dataplus._M_p = (pointer)local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"\x1b[34m","");
  local_78 = &this->magenta;
  local_148 = &(this->magenta).field_2;
  (this->magenta)._M_dataplus._M_p = (pointer)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"\x1b[35m","");
  local_d0 = &this->cyan;
  local_150 = &(this->cyan).field_2;
  (this->cyan)._M_dataplus._M_p = (pointer)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"\x1b[36m","");
  local_d8 = &this->white;
  local_158 = &(this->white).field_2;
  (this->white)._M_dataplus._M_p = (pointer)local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"\x1b[37m","");
  local_160 = &(this->on_black).field_2;
  (this->on_black)._M_dataplus._M_p = (pointer)local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->on_black,"\x1b[40m","");
  local_168 = &(this->on_red).field_2;
  (this->on_red)._M_dataplus._M_p = (pointer)local_168;
  local_80 = &this->on_black;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->on_red,"\x1b[41m","");
  local_170 = &(this->on_green).field_2;
  (this->on_green)._M_dataplus._M_p = (pointer)local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->on_green,"\x1b[42m","");
  local_90 = &this->on_yellow;
  local_178 = &(this->on_yellow).field_2;
  (this->on_yellow)._M_dataplus._M_p = (pointer)local_178;
  local_88 = &this->on_green;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"\x1b[43m","");
  local_98 = &this->on_blue;
  local_180 = &(this->on_blue).field_2;
  (this->on_blue)._M_dataplus._M_p = (pointer)local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"\x1b[44m","");
  local_a0 = &this->on_magenta;
  local_188 = &(this->on_magenta).field_2;
  (this->on_magenta)._M_dataplus._M_p = (pointer)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"\x1b[45m","");
  local_a8 = &this->on_cyan;
  local_190 = &(this->on_cyan).field_2;
  (this->on_cyan)._M_dataplus._M_p = (pointer)local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"\x1b[46m","");
  local_198 = &(this->on_white).field_2;
  (this->on_white)._M_dataplus._M_p = (pointer)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->on_white,"\x1b[47m","");
  __stream = _stdout;
  this->target_file_ = (FILE *)_stdout;
  this->mutex_ = (mutex_t *)details::console_mutex::mutex()::s_mutex;
  (this->colors_)._M_h._M_buckets = &(this->colors_)._M_h._M_single_bucket;
  (this->colors_)._M_h._M_bucket_count = 1;
  (this->colors_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->colors_)._M_h._M_element_count = 0;
  (this->colors_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->colors_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->colors_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  iVar3 = fileno(__stream);
  iVar3 = isatty(iVar3);
  if (iVar3 != 0) {
    local_1c0._M_dataplus._M_p = getenv("TERM");
    if (local_1c0._M_dataplus._M_p != (char *)0x0) {
      if (details::os::is_color_terminal()::result == '\0') {
        iVar3 = __cxa_guard_acquire(&details::os::is_color_terminal()::result);
        if (iVar3 != 0) {
          ppcVar5 = std::
                    __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_pred<spdlog::details::os::is_color_terminal()::_lambda(char_const*)_1_>>
                              (details::os::is_color_terminal()::Terms,
                               &std::
                                _Sp_counted_ptr_inplace<spdlog::sinks::rotating_file_sink<std::mutex>,std::allocator<spdlog::sinks::rotating_file_sink<std::mutex>>,(__gnu_cxx::_Lock_policy)2>
                                ::vtable,&local_1c0);
          details::os::is_color_terminal()::result =
               ppcVar5 !=
               (char **)&std::
                         _Sp_counted_ptr_inplace<spdlog::sinks::rotating_file_sink<std::mutex>,std::allocator<spdlog::sinks::rotating_file_sink<std::mutex>>,(__gnu_cxx::_Lock_policy)2>
                         ::vtable;
          __cxa_guard_release(&details::os::is_color_terminal()::result);
        }
      }
      uVar2 = details::os::is_color_terminal()::result;
      goto LAB_001b4d15;
    }
  }
  uVar2 = false;
LAB_001b4d15:
  this_00 = &this->colors_;
  this->should_do_colors_ = (bool)uVar2;
  local_1c0._M_dataplus._M_p._0_4_ = 0;
  pmVar4 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_1c0);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  local_1c0._M_dataplus._M_p._0_4_ = 1;
  pmVar4 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_1c0);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  local_1c0._M_dataplus._M_p._0_4_ = 2;
  pmVar4 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_1c0);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  std::operator+(&local_1c0,local_c8,local_1a0);
  local_1c4 = warn;
  pmVar4 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_1c4);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_1c0);
  paVar1 = &local_1c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_1c0,local_c0,local_1a0);
  local_1c4 = err;
  pmVar4 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_1c4);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_1c0,local_1a0,&this->on_red);
  local_1c4 = critical;
  pmVar4 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_1c4);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  local_1c0._M_dataplus._M_p._0_4_ = 6;
  pmVar4 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_1c0);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  return;
}

Assistant:

ansicolor_sink()
        : target_file_(TargetStream::stream())
        , mutex_(ConsoleMutex::mutex())

    {
        should_do_colors_ = details::os::in_terminal(target_file_) && details::os::is_color_terminal();
        colors_[level::trace] = white;
        colors_[level::debug] = cyan;
        colors_[level::info] = green;
        colors_[level::warn] = yellow + bold;
        colors_[level::err] = red + bold;
        colors_[level::critical] = bold + on_red;
        colors_[level::off] = reset;
    }